

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.cpp
# Opt level: O1

void __thiscall ZXing::BitMatrix::rotate90(BitMatrix *this)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  int x;
  long lVar4;
  BitMatrix result;
  BitMatrix local_40;
  
  BitMatrix(&local_40,this->_height,this->_width);
  if (0 < this->_width) {
    x = 0;
    iVar3 = -1;
    do {
      if (0 < this->_height) {
        lVar4 = 0;
        do {
          bVar1 = get(this,x,(int)lVar4);
          if (bVar1) {
            lVar2 = (long)((this->_width + iVar3) * local_40._width);
            if ((ulong)((long)local_40._bits.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_40._bits.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) <= (ulong)(lVar4 + lVar2)) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            local_40._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start[lVar4 + lVar2] = 0xff;
          }
          lVar4 = lVar4 + 1;
        } while ((int)lVar4 < this->_height);
      }
      x = x + 1;
      iVar3 = iVar3 + -1;
    } while (x < this->_width);
  }
  this->_width = local_40._width;
  this->_height = local_40._height;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->_bits,&local_40._bits);
  if (local_40._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
BitMatrix::rotate90()
{
	BitMatrix result(height(), width());
	for (int x = 0; x < width(); ++x) {
		for (int y = 0; y < height(); ++y) {
			if (get(x, y)) {
				result.set(y, width() - x - 1);
			}
		}
	}
	*this = std::move(result);
}